

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_tests.cpp
# Opt level: O2

void immutable::test_internal_node(void)

{
  internal_node<char,_true> *piVar1;
  ref<immutable::rrb_details::internal_node<char,_true>_> in;
  ref<immutable::rrb_details::internal_node<char,_true>_> copy;
  ref<immutable::rrb_details::internal_node<char,_true>_> dec;
  ref<immutable::rrb_details::internal_node<char,_true>_> inc;
  
  in.ptr = rrb_details::internal_node_create<char,true>(8);
  if (in.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((in.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  copy.ptr = rrb_details::internal_node_create<char,true>(5);
  if (copy.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((copy.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  ref<immutable::rrb_details::internal_node<char,_true>_>::operator=(piVar1->child,&copy);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&copy);
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x57,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  TestEq<bool,bool>(true,piVar1->len == 8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x58,"void immutable::test_internal_node()");
  copy.ptr = rrb_details::internal_node_clone<char,true>(in.ptr);
  if (copy.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((copy.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&copy);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5c,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&copy);
  TestEq<bool,bool>(true,piVar1->len == 8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5d,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar1->child);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x5e,"void immutable::test_internal_node()");
  inc.ptr = rrb_details::internal_node_inc<char,true>(in.ptr);
  if (inc.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((inc.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&inc);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x61,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&inc);
  TestEq<bool,bool>(true,piVar1->len == 9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x62,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar1->child);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,99,"void immutable::test_internal_node()");
  dec.ptr = rrb_details::internal_node_dec<char,true>(in.ptr);
  if (dec.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((dec.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&dec);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x66,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&dec);
  TestEq<bool,bool>(true,piVar1->len == 7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x67,"void immutable::test_internal_node()");
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&in);
  piVar1 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(piVar1->child);
  TestEq<bool,bool>(true,(piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i == 4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x68,"void immutable::test_internal_node()");
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&dec);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&inc);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&copy);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&in);
  return;
}

Assistant:

void test_internal_node()
    {
    using namespace rrb_details;

    ref<internal_node<char, true>> in = internal_node_create<char, true>(8);

    in->child[0] = internal_node_create<char, true>(5);
    TEST_ASSERT(in->_ref_count == 1);
    TEST_ASSERT(in->len == 8);

    ref<internal_node<char, true>> copy = internal_node_clone(in.ptr);

    TEST_ASSERT(copy->_ref_count == 1);
    TEST_ASSERT(copy->len == 8);
    TEST_ASSERT(in->child[0]->_ref_count == 2);

    ref<internal_node<char, true>> inc = internal_node_inc(in.ptr);
    TEST_ASSERT(inc->_ref_count == 1);
    TEST_ASSERT(inc->len == 9);
    TEST_ASSERT(in->child[0]->_ref_count == 3);

    ref<internal_node<char, true>> dec = internal_node_dec(in.ptr);
    TEST_ASSERT(dec->_ref_count == 1);
    TEST_ASSERT(dec->len == 7);
    TEST_ASSERT(in->child[0]->_ref_count == 4);
    }